

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolve_avx2.h
# Opt level: O0

__m128i y_convolve_2tap_4x2_ssse3(uint8_t *src,ptrdiff_t stride,__m128i *coeffs,__m128i *s_32)

{
  undefined1 (*in_RCX) [16];
  __m128i *in_RDX;
  long in_RSI;
  long in_RDI;
  __m128i alVar1;
  __m128i ss;
  __m128i s_128 [2];
  __m128i local_f8;
  undefined1 local_e8 [16];
  undefined1 local_d8 [16];
  undefined1 (*local_c8) [16];
  __m128i *local_c0;
  long local_b8;
  long local_b0;
  undefined1 local_a8 [16];
  uint local_8c;
  undefined1 local_88 [16];
  uint local_6c;
  undefined8 local_68;
  undefined8 uStack_60;
  undefined8 local_58;
  undefined8 uStack_50;
  undefined8 local_48;
  undefined8 uStack_40;
  undefined8 local_38;
  undefined8 uStack_30;
  undefined8 local_28;
  undefined8 uStack_20;
  undefined8 local_18;
  undefined8 uStack_10;
  
  local_c8 = in_RCX;
  local_c0 = in_RDX;
  local_b8 = in_RSI;
  local_b0 = in_RDI;
  local_6c = loadu_int32((void *)(in_RDI + in_RSI));
  local_88._4_4_ = 0;
  local_88._0_4_ = local_6c;
  *(undefined8 *)local_c8[1] = local_88._0_8_;
  *(undefined8 *)(local_c8[1] + 8) = 0;
  local_18 = *(undefined8 *)*local_c8;
  uStack_10 = *(undefined8 *)(*local_c8 + 8);
  local_28 = *(undefined8 *)local_c8[1];
  uStack_20 = *(undefined8 *)(local_c8[1] + 8);
  local_e8 = vpunpckldq_avx(*local_c8,local_c8[1]);
  local_88 = ZEXT416(local_6c);
  local_8c = loadu_int32((void *)(local_b0 + local_b8 * 2));
  local_a8._4_4_ = 0;
  local_a8._0_4_ = local_8c;
  *(undefined8 *)*local_c8 = local_a8._0_8_;
  *(undefined8 *)(*local_c8 + 8) = 0;
  local_48 = *(undefined8 *)*local_c8;
  uStack_40 = *(undefined8 *)(*local_c8 + 8);
  local_38 = *(undefined8 *)local_c8[1];
  uStack_30 = *(undefined8 *)(local_c8[1] + 8);
  local_d8 = vpunpckldq_avx(local_c8[1],*local_c8);
  local_58 = local_e8._0_8_;
  uStack_50 = local_e8._8_8_;
  local_68 = local_d8._0_8_;
  uStack_60 = local_d8._8_8_;
  local_f8 = (__m128i)vpunpcklbw_avx(local_e8,local_d8);
  local_a8 = ZEXT416(local_8c);
  alVar1 = convolve_2tap_ssse3(&local_f8,local_c0);
  alVar1[0] = alVar1[0];
  alVar1[1] = alVar1[1];
  return alVar1;
}

Assistant:

static inline __m128i y_convolve_2tap_4x2_ssse3(const uint8_t *const src,
                                                const ptrdiff_t stride,
                                                const __m128i coeffs[1],
                                                __m128i s_32[2]) {
  __m128i s_128[2];

  s_32[1] = _mm_cvtsi32_si128(loadu_int32(src + stride));
  s_128[0] = _mm_unpacklo_epi32(s_32[0], s_32[1]);
  s_32[0] = _mm_cvtsi32_si128(loadu_int32(src + 2 * stride));
  s_128[1] = _mm_unpacklo_epi32(s_32[1], s_32[0]);
  const __m128i ss = _mm_unpacklo_epi8(s_128[0], s_128[1]);
  return convolve_2tap_ssse3(&ss, coeffs);
}